

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

optional<pbrt::MediumInteraction> * __thiscall
pstd::optional<pbrt::MediumInteraction>::operator=
          (optional<pbrt::MediumInteraction> *this,MediumInteraction *v)

{
  uintptr_t uVar1;
  Interval<float> IVar2;
  Interval<float> IVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  
  reset(this);
  *(MediumInterface **)((long)&this->optionalValue + 0x40) = (v->super_Interaction).mediumInterface;
  IVar2 = (v->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  IVar3 = (v->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  uVar4 = *(undefined8 *)&(v->super_Interaction).time;
  uVar5 = *(undefined8 *)&(v->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  uVar6 = *(undefined8 *)&(v->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>;
  uVar7 = *(undefined8 *)&(v->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  uVar8 = *(undefined8 *)&(v->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>.y;
  (this->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)
       (v->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  *(Interval<float> *)((long)&this->optionalValue + 8) = IVar2;
  *(Interval<float> *)((long)&this->optionalValue + 0x10) = IVar3;
  *(undefined8 *)((long)&this->optionalValue + 0x18) = uVar4;
  *(undefined8 *)((long)&this->optionalValue + 0x20) = uVar5;
  *(undefined8 *)((long)&this->optionalValue + 0x28) = uVar6;
  *(undefined8 *)((long)&this->optionalValue + 0x30) = uVar7;
  *(undefined8 *)((long)&this->optionalValue + 0x38) = uVar8;
  *(undefined8 *)((long)&this->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&this->optionalValue + 0x50) = 0;
  uVar1 = (v->phase).super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
  *(uintptr_t *)((long)&this->optionalValue + 0x48) =
       (v->super_Interaction).medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       .bits;
  *(uintptr_t *)((long)&this->optionalValue + 0x50) = uVar1;
  uVar4 = *(undefined8 *)((v->sigma_a).values.values + 2);
  uVar5 = *(undefined8 *)(v->sigma_s).values.values;
  uVar6 = *(undefined8 *)((v->sigma_s).values.values + 2);
  uVar7 = *(undefined8 *)(v->sigma_maj).values.values;
  uVar8 = *(undefined8 *)((v->sigma_maj).values.values + 2);
  uVar9 = *(undefined8 *)(v->Le).values.values;
  uVar10 = *(undefined8 *)((v->Le).values.values + 2);
  *(undefined8 *)((long)&this->optionalValue + 0x58) = *(undefined8 *)(v->sigma_a).values.values;
  *(undefined8 *)((long)&this->optionalValue + 0x60) = uVar4;
  *(undefined8 *)((long)&this->optionalValue + 0x68) = uVar5;
  *(undefined8 *)((long)&this->optionalValue + 0x70) = uVar6;
  *(undefined8 *)((long)&this->optionalValue + 0x78) = uVar7;
  *(undefined8 *)((long)&this->optionalValue + 0x80) = uVar8;
  *(undefined8 *)((long)&this->optionalValue + 0x88) = uVar9;
  *(undefined8 *)((long)&this->optionalValue + 0x90) = uVar10;
  this->set = true;
  return this;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(const T &v) {
        reset();
        new (ptr()) T(v);
        set = true;
        return *this;
    }